

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.cpp
# Opt level: O2

ostream * glu::operator<<(ostream *str,TypeAccessFormat *format)

{
  Type TVar1;
  int iVar2;
  TypeComponentVector *pTVar3;
  ostream *poVar4;
  pointer pVVar5;
  char *pcVar6;
  VarType *pVVar7;
  pointer pSVar8;
  
  pVVar7 = format->type;
  pTVar3 = format->path;
  pVVar5 = (pTVar3->
           super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>).
           _M_impl.super__Vector_impl_data._M_start;
  do {
    if (pVVar5 == (pTVar3->
                  super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>)
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return str;
    }
    TVar1 = pVVar5->type;
    if (TVar1 - MATRIX_COLUMN < 2) {
LAB_015550dc:
      poVar4 = std::operator<<(str,"[");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,pVVar5->index);
      pcVar6 = "]";
LAB_01555134:
      std::operator<<(poVar4,pcVar6);
    }
    else {
      if (TVar1 == STRUCT_MEMBER) {
        iVar2 = pVVar5->index;
        pSVar8 = (((pVVar7->m_data).structPtr)->m_members).
                 super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                 super__Vector_impl_data._M_start;
        poVar4 = std::operator<<(str,".");
        pSVar8 = pSVar8 + iVar2;
        pVVar7 = &pSVar8->m_type;
        pcVar6 = (pSVar8->m_name)._M_dataplus._M_p;
        goto LAB_01555134;
      }
      if (TVar1 == ARRAY_ELEMENT) {
        pVVar7 = (pVVar7->m_data).array.elementType;
        goto LAB_015550dc;
      }
    }
    pVVar5 = pVVar5 + 1;
    pTVar3 = format->path;
  } while( true );
}

Assistant:

std::ostream& operator<< (std::ostream& str, const TypeAccessFormat& format)
{
	const VarType* curType = &format.type;

	for (TypeComponentVector::const_iterator iter = format.path.begin(); iter != format.path.end(); iter++)
	{
		switch (iter->type)
		{
			case VarTypeComponent::ARRAY_ELEMENT:
				curType = &curType->getElementType(); // Update current type.
				// Fall-through.

			case VarTypeComponent::MATRIX_COLUMN:
			case VarTypeComponent::VECTOR_COMPONENT:
				str << "[" << iter->index << "]";
				break;

			case VarTypeComponent::STRUCT_MEMBER:
			{
				const StructMember& member = curType->getStructPtr()->getMember(iter->index);
				str << "." << member.getName();
				curType = &member.getType();
				break;
			}

			default:
				DE_ASSERT(false);
		}
	}

	return str;
}